

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlFileRead(void *context,char *buffer,int len)

{
  size_t sVar1;
  int ret;
  int len_local;
  char *buffer_local;
  void *context_local;
  
  if ((context == (void *)0x0) || (buffer == (char *)0x0)) {
    context_local._4_4_ = -1;
  }
  else {
    sVar1 = fread(buffer,1,(long)len,(FILE *)context);
    context_local._4_4_ = (int)sVar1;
    if (context_local._4_4_ < 0) {
      xmlIOErr(0,"fread()");
    }
  }
  return context_local._4_4_;
}

Assistant:

int
xmlFileRead (void * context, char * buffer, int len) {
    int ret;
    if ((context == NULL) || (buffer == NULL))
        return(-1);
    ret = fread(&buffer[0], 1,  len, (FILE *) context);
    if (ret < 0) xmlIOErr(0, "fread()");
    return(ret);
}